

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  float fVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  CostInterval *pCVar5;
  int iVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  CostCacheInterval *cur;
  ushort *ptr;
  double *output;
  CostManager *manager;
  VP8LHistogram *p;
  CostInterval *pCVar10;
  CostCacheInterval *pCVar11;
  float *pfVar12;
  CostInterval *pCVar13;
  ushort *puVar14;
  CostInterval *pCVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint64_t nmemb;
  uint uVar21;
  bool bVar22;
  uint64_t nmemb_00;
  CostManager *pCVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ushort *puVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  VP8LColorCache hashers;
  double local_b0;
  VP8LRefsCursor local_80;
  double *local_68;
  VP8LBackwardRefs *local_60;
  VP8LHashChain *local_58;
  VP8LColorCache local_50;
  CostInterval *local_40;
  double *local_38;
  
  uVar27 = ysize * xsize;
  nmemb = (uint64_t)(int)uVar27;
  local_58 = hash_chain;
  ptr = (ushort *)WebPSafeMalloc(nmemb,2);
  if (ptr == (ushort *)0x0) {
    uVar27 = 0;
    goto LAB_00146c7e;
  }
  iVar8 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
  if (cache_bits < 1) {
    iVar8 = 0x118;
  }
  local_60 = refs_src;
  output = (double *)WebPSafeCalloc(1,(long)iVar8 * 8 + 0x1948);
  manager = (CostManager *)WebPSafeMalloc(1,0x8178);
  bVar22 = false;
  if (manager != (CostManager *)0x0 && output != (double *)0x0) {
    output[0x328] = (double)(output + 0x329);
    if (0 < cache_bits) {
      iVar8 = VP8LColorCacheInit(&local_50,cache_bits);
      bVar22 = false;
      if (iVar8 == 0) goto LAB_00146ac2;
    }
    VP8LRefsCursorInit(&local_80,local_60);
    p = VP8LAllocateHistogram(cache_bits);
    if (p == (VP8LHistogram *)0x0) {
      bVar22 = false;
      VP8LFreeHistogram((VP8LHistogram *)0x0);
    }
    else {
      local_68 = output;
      VP8LHistogramInit(p,cache_bits,1);
      if (local_80.cur_pos != (PixOrCopy *)0x0) {
        do {
          VP8LHistogramAddSinglePixOrCopy(p,local_80.cur_pos,VP8LDistanceToPlaneCode,xsize);
          local_80.cur_pos = local_80.cur_pos + 1;
          if (local_80.cur_pos == local_80.last_pos_) {
            VP8LRefsCursorNextBlock(&local_80);
          }
        } while (local_80.cur_pos != (PixOrCopy *)0x0);
      }
      output = local_68;
      iVar8 = (1 << ((byte)p->palette_code_bits_ & 0x1f)) + 0x118;
      if (p->palette_code_bits_ < 1) {
        iVar8 = 0x118;
      }
      ConvertPopulationCountTableToBitEstimates(iVar8,p->literal_,(double *)local_68[0x328]);
      ConvertPopulationCountTableToBitEstimates(0x100,p->red_,output + 0x100);
      ConvertPopulationCountTableToBitEstimates(0x100,p->blue_,output + 0x200);
      ConvertPopulationCountTableToBitEstimates(0x100,p->alpha_,output);
      local_38 = output + 0x300;
      ConvertPopulationCountTableToBitEstimates(0x28,p->distance_,local_38);
      VP8LFreeHistogram(p);
      manager->costs_ = (float *)0x0;
      manager->cache_intervals_ = (CostCacheInterval *)0x0;
      manager->head_ = (CostInterval *)0x0;
      manager->recycled_intervals_ = (CostInterval *)0x0;
      manager->count_ = 0;
      manager->dist_array_ = ptr;
      pCVar10 = (CostInterval *)(manager->cost_cache_ + 0xffd);
      lVar18 = 10;
      pCVar15 = (CostInterval *)0x0;
      do {
        pCVar10[1].next_ = pCVar15;
        pCVar10 = pCVar10 + 1;
        lVar18 = lVar18 + -1;
        pCVar15 = pCVar10;
      } while (lVar18 != 0);
      uVar19 = 0xfff;
      if ((int)uVar27 < 0xfff) {
        uVar19 = (ulong)uVar27;
      }
      manager->free_intervals_ = pCVar10;
      manager->cache_intervals_size_ = 1;
      dVar32 = output[0x328];
      dVar29 = *(double *)((long)dVar32 + 0x800) + 0.0;
      manager->cost_cache_[0] = dVar29;
      nmemb_00 = 1;
      if (1 < (int)uVar27) {
        uVar16 = 0;
        do {
          uVar20 = uVar16 + 1;
          if (uVar20 < 0x200) {
            uVar25 = (uint)kPrefixEncodeCode[uVar16 + 1].code_;
            uVar24 = (uint)kPrefixEncodeCode[uVar16 + 1].extra_bits_;
          }
          else {
            uVar25 = 0x1f;
            uVar21 = (uint)uVar16;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar25 == 0; uVar25 = uVar25 - 1) {
              }
            }
            uVar24 = 0x1e - (uVar25 ^ 0x1f);
            uVar25 = (uint)((uVar21 >> (uVar24 & 0x1f) & 1) != 0) + (uVar25 ^ 0x1f) * 2 ^ 0x3e;
          }
          dVar31 = (double)(int)uVar24 + *(double *)((long)dVar32 + 0x800 + (long)(int)uVar25 * 8);
          manager->cost_cache_[uVar16 + 1] = dVar31;
          if ((dVar31 != dVar29) || (NAN(dVar31) || NAN(dVar29))) {
            nmemb_00 = nmemb_00 + 1;
            manager->cache_intervals_size_ = nmemb_00;
          }
          uVar16 = uVar20;
          dVar29 = dVar31;
        } while (uVar19 - 1 != uVar20);
      }
      pCVar11 = (CostCacheInterval *)WebPSafeMalloc(nmemb_00,0x10);
      manager->cache_intervals_ = pCVar11;
      if (pCVar11 != (CostCacheInterval *)0x0) {
        pCVar11->start_ = 0;
        pCVar11->end_ = 1;
        dVar32 = manager->cost_cache_[0];
        pCVar11->cost_ = dVar32;
        if (1 < (int)uVar27) {
          lVar18 = 0;
          do {
            dVar29 = manager->cost_cache_[lVar18 + 1];
            if ((dVar29 != dVar32) || (NAN(dVar29) || NAN(dVar32))) {
              pCVar11[1].start_ = (int)lVar18 + 1;
              pCVar11[1].cost_ = dVar29;
              pCVar11 = pCVar11 + 1;
              dVar32 = dVar29;
            }
            pCVar11->end_ = (int)lVar18 + 2;
            lVar18 = lVar18 + 1;
          } while (uVar19 - 1 != lVar18);
        }
        pfVar12 = (float *)WebPSafeMalloc(nmemb,4);
        manager->costs_ = pfVar12;
        auVar7 = _DAT_00148240;
        if (pfVar12 != (float *)0x0) {
          if (0 < (int)uVar27) {
            lVar18 = nmemb - 1;
            auVar30._8_4_ = (int)lVar18;
            auVar30._0_8_ = lVar18;
            auVar30._12_4_ = (int)((ulong)lVar18 >> 0x20);
            uVar19 = 0;
            auVar30 = auVar30 ^ _DAT_00148240;
            auVar33 = _DAT_00149740;
            auVar34 = _DAT_00149560;
            do {
              auVar35 = auVar34 ^ auVar7;
              iVar8 = auVar30._4_4_;
              if ((bool)(~(auVar35._4_4_ == iVar8 && auVar30._0_4_ < auVar35._0_4_ ||
                          iVar8 < auVar35._4_4_) & 1)) {
                pfVar12[uVar19] = 1e+38;
              }
              if ((auVar35._12_4_ != auVar30._12_4_ || auVar35._8_4_ <= auVar30._8_4_) &&
                  auVar35._12_4_ <= auVar30._12_4_) {
                pfVar12[uVar19 + 1] = 1e+38;
              }
              auVar35 = auVar33 ^ auVar7;
              iVar9 = auVar35._4_4_;
              if (iVar9 <= iVar8 && (iVar9 != iVar8 || auVar35._0_4_ <= auVar30._0_4_)) {
                pfVar12[uVar19 + 2] = 1e+38;
                pfVar12[uVar19 + 3] = 1e+38;
              }
              uVar19 = uVar19 + 4;
              lVar18 = auVar34._8_8_;
              auVar34._0_8_ = auVar34._0_8_ + 4;
              auVar34._8_8_ = lVar18 + 4;
              lVar18 = auVar33._8_8_;
              auVar33._0_8_ = auVar33._0_8_ + 4;
              auVar33._8_8_ = lVar18 + 4;
            } while ((uVar27 + 3 & 0xfffffffc) != uVar19);
          }
          *ptr = 0;
          uVar25 = *argb;
          if (cache_bits < 1) {
LAB_00146622:
            dVar32 = (output[uVar25 >> 0x18] +
                      *(double *)((long)output + (ulong)(uVar25 >> 0xd & 0x7f8) + 0x800) +
                      *(double *)((long)output[0x328] + (ulong)(uVar25 >> 8 & 0xff) * 8) +
                     output[(ulong)(uVar25 & 0xff) + 0x200]) * 0.82;
          }
          else {
            uVar21 = uVar25 * 0x1e35a7bd >> ((byte)local_50.hash_shift_ & 0x1f);
            if (((int)uVar21 < 0) || (local_50.colors_[(int)uVar21] != uVar25)) {
              local_50.colors_[(int)uVar21] = uVar25;
              goto LAB_00146622;
            }
            dVar32 = *(double *)((long)output[0x328] + (long)(int)(uVar21 + 0x118) * 8) * 0.68;
          }
          if (dVar32 + 0.0 < (double)*pfVar12) {
            *pfVar12 = (float)(dVar32 + 0.0);
            *ptr = 1;
          }
          if (1 < (int)uVar27) {
            pCVar10 = manager->intervals_ + 9;
            local_b0 = -1.0;
            iVar9 = -1;
            iVar8 = 0;
            uVar19 = 1;
            uVar27 = 0xffffffff;
            uVar25 = 0xffffffff;
            local_40 = pCVar10;
            do {
              puVar4 = local_58->offset_length_;
              uVar21 = puVar4[uVar19];
              pfVar12 = manager->costs_;
              fVar1 = pfVar12[uVar19 - 1];
              uVar24 = argb[uVar19];
              if (cache_bits < 1) {
LAB_00146770:
                dVar32 = (local_68[uVar24 >> 0x18] +
                          *(double *)((long)local_68 + (ulong)(uVar24 >> 0xd & 0x7f8) + 0x800) +
                          *(double *)((long)local_68[0x328] + (ulong)(uVar24 >> 8 & 0xff) * 8) +
                         local_68[(ulong)(uVar24 & 0xff) + 0x200]) * 0.82;
              }
              else {
                uVar26 = uVar24 * 0x1e35a7bd >> ((byte)local_50.hash_shift_ & 0x1f);
                if (((int)uVar26 < 0) || (local_50.colors_[(int)uVar26] != uVar24)) {
                  local_50.colors_[(int)uVar26] = uVar24;
                  goto LAB_00146770;
                }
                dVar32 = *(double *)((long)local_68[0x328] + (long)(int)(uVar26 + 0x118) * 8) * 0.68
                ;
              }
              dVar32 = dVar32 + (double)fVar1;
              if (dVar32 < (double)pfVar12[uVar19]) {
                pfVar12[uVar19] = (float)dVar32;
                ptr[uVar19] = 1;
              }
              uVar24 = uVar21 >> 0xc;
              uVar21 = uVar21 & 0xfff;
              iVar17 = (int)uVar19;
              if (1 < uVar21) {
                if (uVar24 == uVar27) {
                  iVar6 = iVar17 + -2 + uVar25;
                  if (iVar9 == 0) {
                    iVar6 = iVar8;
                  }
                  iVar9 = 0;
                  iVar8 = iVar6;
                  if (iVar6 < (int)(iVar17 + uVar21 + -1)) {
                    uVar25 = 0;
                    uVar16 = uVar19 & 0xffffffff;
                    if ((long)uVar19 <= (long)iVar6) {
                      uVar16 = uVar19;
                      do {
                        lVar18 = uVar16 + 1;
                        if (puVar4[lVar18] >> 0xc != uVar27) {
                          uVar25 = puVar4[uVar16 & 0xffffffff] & 0xfff;
                          goto LAB_00146911;
                        }
                        bVar22 = (long)uVar16 < (long)iVar6;
                        uVar16 = uVar16 + 1;
                      } while (bVar22);
                      uVar25 = puVar4[lVar18] & 0xfff;
                      uVar16 = (ulong)(iVar6 + 1);
                    }
LAB_00146911:
                    iVar8 = (int)uVar16;
                    iVar17 = iVar8 + -1;
                    pCVar10 = manager->head_;
                    pCVar15 = pCVar10;
                    if (pCVar10 != (CostInterval *)0x0) {
                      do {
                        if (iVar8 <= pCVar15->start_) break;
                        pCVar13 = pCVar15->next_;
                        if ((iVar8 <= pCVar15->end_) && (pCVar15->cost_ < pfVar12[iVar17])) {
                          iVar9 = pCVar15->index_;
                          pfVar12[iVar17] = pCVar15->cost_;
                          manager->dist_array_[iVar17] = ((short)iVar17 - (short)iVar9) + 1;
                        }
                        pCVar15 = pCVar13;
                      } while (pCVar13 != (CostInterval *)0x0);
                      uVar20 = uVar16 & 0xffffffff;
                      do {
                        if (iVar8 < pCVar10->start_) break;
                        pCVar15 = pCVar10->next_;
                        if ((iVar8 < pCVar10->end_) && (pCVar10->cost_ < pfVar12[uVar20])) {
                          iVar9 = pCVar10->index_;
                          pfVar12[uVar20] = pCVar10->cost_;
                          manager->dist_array_[uVar20] = ((short)uVar16 - (short)iVar9) + 1;
                        }
                        pCVar10 = pCVar15;
                      } while (pCVar15 != (CostInterval *)0x0);
                    }
                    PushInterval(manager,(double)pfVar12[iVar17] + local_b0,iVar8,uVar25);
                    iVar9 = 0;
                    pCVar10 = local_40;
                    iVar8 = iVar17 + uVar25;
                  }
                }
                else {
                  iVar9 = VP8LDistanceToPlaneCode(xsize,uVar24);
                  if (iVar9 < 0x200) {
                    uVar27 = (uint)kPrefixEncodeCode[iVar9].code_;
                    uVar26 = (uint)kPrefixEncodeCode[iVar9].extra_bits_;
                  }
                  else {
                    uVar25 = iVar9 - 1;
                    uVar27 = 0x1f;
                    if (uVar25 != 0) {
                      for (; uVar25 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                      }
                    }
                    uVar26 = 0x1e - (uVar27 ^ 0x1f);
                    uVar27 = (uint)((uVar25 >> (uVar26 & 0x1f) & 1) != 0) + (uVar27 ^ 0x1f) * 2 ^
                             0x3e;
                  }
                  local_b0 = (double)(int)uVar26 + local_38[(int)uVar27];
                  PushInterval(manager,(double)fVar1 + local_b0,iVar17,uVar21);
                  iVar9 = 1;
                }
              }
              pCVar15 = manager->head_;
              while ((pCVar13 = pCVar15, pCVar13 != (CostInterval *)0x0 &&
                     ((long)pCVar13->start_ <= (long)uVar19))) {
                pCVar15 = pCVar13->next_;
                if ((long)uVar19 < (long)pCVar13->end_) {
                  if (pCVar13->cost_ < manager->costs_[uVar19]) {
                    iVar17 = pCVar13->index_;
                    manager->costs_[uVar19] = pCVar13->cost_;
                    manager->dist_array_[uVar19] = ((short)uVar19 - (short)iVar17) + 1;
                  }
                }
                else {
                  pCVar5 = pCVar13->previous_;
                  pCVar23 = (CostManager *)&pCVar5->next_;
                  if (pCVar5 == (CostInterval *)0x0) {
                    pCVar23 = manager;
                  }
                  pCVar23->head_ = pCVar15;
                  if (pCVar15 != (CostInterval *)0x0) {
                    pCVar15->previous_ = pCVar5;
                  }
                  bVar22 = pCVar10 < pCVar13 || pCVar13 < manager->intervals_;
                  pCVar5 = (&manager->free_intervals_)[bVar22];
                  (&manager->free_intervals_)[bVar22] = pCVar13;
                  pCVar13->next_ = pCVar5;
                  manager->count_ = manager->count_ + -1;
                }
              }
              uVar19 = uVar19 + 1;
              uVar27 = uVar24;
              uVar25 = uVar21;
            } while (uVar19 != nmemb);
          }
          bVar22 = local_60->error_ == 0;
          output = local_68;
          goto LAB_00146ab3;
        }
      }
      CostManagerClear(manager);
      bVar22 = false;
    }
LAB_00146ab3:
    if (0 < cache_bits) {
      VP8LColorCacheClear(&local_50);
    }
  }
LAB_00146ac2:
  uVar27 = 0;
  CostManagerClear(manager);
  WebPSafeFree(output);
  WebPSafeFree(manager);
  if (bVar22) {
    puVar28 = ptr + nmemb;
    for (puVar14 = ptr + (nmemb - 1); ptr <= puVar14;
        puVar14 = (ushort *)((long)puVar14 - (ulong)((uint)uVar2 * 2))) {
      uVar2 = *puVar14;
      puVar28[-1] = uVar2;
      puVar28 = puVar28 + -1;
    }
    if ((cache_bits < 1) ||
       (iVar8 = VP8LColorCacheInit((VP8LColorCache *)&local_80,cache_bits), iVar8 != 0)) {
      VP8LClearBackwardRefs(refs_dst);
      uVar27 = (uint)((ulong)((long)(ptr + nmemb) - (long)puVar28) >> 1);
      if (0 < (int)uVar27) {
        uVar19 = 0;
        uVar25 = 0;
        do {
          uVar2 = puVar28[uVar19];
          if (uVar2 == 1) {
            if (cache_bits < 1) {
LAB_00146bb4:
              uVar21 = argb[uVar25];
              uVar16 = 0x10000;
            }
            else {
              uVar3 = argb[uVar25];
              uVar21 = uVar3 * 0x1e35a7bd >> ((byte)local_80.cur_block_ & 0x1f);
              uVar16 = 0x10001;
              if (*(uint32_t *)(&(local_80.cur_pos)->mode + (long)(int)uVar21 * 4) != uVar3 ||
                  (int)uVar21 < 0) {
                *(uint32_t *)(&(local_80.cur_pos)->mode + (long)(int)uVar21 * 4) = uVar3;
                goto LAB_00146bb4;
              }
            }
            VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar21 << 0x20 | uVar16));
          }
          else {
            VP8LBackwardRefsCursorAdd
                      (refs_dst,(PixOrCopy)
                                ((ulong)CONCAT42(local_58->offset_length_[uVar25] >> 0xc,uVar2) *
                                 0x10000 + 2));
            if ((0 < cache_bits) && (uVar2 != 0)) {
              uVar16 = 0;
              do {
                *(uint32_t *)
                 (&(local_80.cur_pos)->mode +
                 (long)(int)(argb[uVar25 + uVar16] * 0x1e35a7bd >>
                            ((byte)local_80.cur_block_ & 0x1f)) * 4) = argb[uVar25 + uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar2 != uVar16);
            }
          }
          uVar25 = uVar25 + uVar2;
          uVar19 = uVar19 + 1;
        } while (uVar19 != (uVar27 & 0x7fffffff));
      }
      bVar22 = refs_dst->error_ == 0;
      if (0 < cache_bits) {
        VP8LColorCacheClear((VP8LColorCache *)&local_80);
      }
    }
    else {
      bVar22 = false;
    }
    uVar27 = (uint)bVar22;
  }
LAB_00146c7e:
  WebPSafeFree(ptr);
  return uVar27;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}